

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O2

bool __thiscall BamTools::FilterTool::FilterToolPrivate::ParseScript(FilterToolPrivate *this)

{
  bool bVar1;
  bool bVar2;
  Value *pVVar3;
  ostream *poVar4;
  int iVar5;
  const_iterator cVar6;
  ValueIteratorBase local_4a8;
  string ruleString;
  string filterName;
  Value root;
  string errs;
  Value filters;
  SelfType local_3e0;
  Value id;
  string document;
  CharReaderBuilder rbuilder;
  Value rule;
  string local_1d0 [32];
  istringstream sin;
  
  GetScriptContents_abi_cxx11_(&document,this);
  std::__cxx11::istringstream::istringstream((istringstream *)&sin,(string *)&document,_S_in);
  Json::Value::Value(&root,nullValue);
  Json::CharReaderBuilder::CharReaderBuilder(&rbuilder);
  errs._M_dataplus._M_p = (pointer)&errs.field_2;
  errs._M_string_length = 0;
  errs.field_2._M_local_buf[0] = '\0';
  bVar1 = Json::parseFromStream(&rbuilder.super_Factory,(istream *)&sin,&root,&errs);
  if (bVar1) {
    pVVar3 = Json::Value::operator[](&root,"filters");
    Json::Value::Value(&filters,pVVar3);
    bVar1 = Json::Value::isNull(&filters);
    if (bVar1) {
      std::__cxx11::string::string((string *)&rule,"ROOT",(allocator *)&ruleString);
      bVar1 = ParseFilterObject(this,(string *)&rule,&root);
      pVVar3 = &rule;
    }
    else {
      cVar6 = Json::Value::begin(&filters);
      local_4a8.current_ = cVar6.super_ValueIteratorBase.current_._M_node;
      local_4a8.isNull_ = cVar6.super_ValueIteratorBase.isNull_;
      cVar6 = Json::Value::end(&filters);
      local_3e0.current_ = cVar6.super_ValueIteratorBase.current_._M_node;
      local_3e0.isNull_ = cVar6.super_ValueIteratorBase.isNull_;
      iVar5 = 0;
      bVar1 = true;
      while( true ) {
        bVar2 = Json::ValueIteratorBase::operator!=(&local_4a8,&local_3e0);
        if (!bVar2) break;
        pVVar3 = Json::ValueIteratorBase::deref(&local_4a8);
        Json::Value::Value((Value *)&ruleString,pVVar3);
        filterName._M_dataplus._M_p = (pointer)&filterName.field_2;
        filterName._M_string_length = 0;
        filterName.field_2._M_local_buf[0] = '\0';
        pVVar3 = Json::Value::operator[]((Value *)&ruleString,"id");
        Json::Value::Value(&id,pVVar3);
        bVar2 = Json::Value::isNull(&id);
        if (bVar2) {
          std::__cxx11::stringstream::stringstream((stringstream *)&rule);
          std::ostream::operator<<(&rule.comments_,iVar5);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)&filterName,local_1d0);
          std::__cxx11::string::~string(local_1d0);
          std::__cxx11::stringstream::~stringstream((stringstream *)&rule);
        }
        else {
          Json::Value::asString_abi_cxx11_((string *)&rule,&id);
          std::__cxx11::string::operator=((string *)&filterName,(string *)&rule);
          std::__cxx11::string::~string((string *)&rule);
        }
        bVar2 = ParseFilterObject(this,&filterName,(Value *)&ruleString);
        Json::Value::~Value(&id);
        std::__cxx11::string::~string((string *)&filterName);
        Json::Value::~Value((Value *)&ruleString);
        Json::ValueIteratorBase::increment(&local_4a8);
        bVar1 = (bool)(bVar1 & bVar2);
        iVar5 = iVar5 + 1;
      }
      ruleString._M_dataplus._M_p = (pointer)&ruleString.field_2;
      ruleString._M_string_length = 0;
      ruleString.field_2._M_local_buf[0] = '\0';
      pVVar3 = Json::Value::operator[](&root,"rule");
      Json::Value::Value(&rule,pVVar3);
      bVar2 = Json::Value::isString(&rule);
      if (bVar2) {
        Json::Value::asString_abi_cxx11_((string *)&id,&rule);
        std::__cxx11::string::operator=((string *)&ruleString,(string *)&id);
        std::__cxx11::string::~string((string *)&id);
      }
      FilterEngine<BamTools::BamAlignmentChecker>::setRule(&this->m_filterEngine,&ruleString);
      Json::Value::~Value(&rule);
      pVVar3 = (Value *)&ruleString;
    }
    std::__cxx11::string::~string((string *)pVVar3);
    Json::Value::~Value(&filters);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "bamtools filter ERROR: failed to parse script - see error message(s) below"
                            );
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    std::operator<<(poVar4,(string *)&errs);
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&errs);
  Json::CharReaderBuilder::~CharReaderBuilder(&rbuilder);
  Json::Value::~Value(&root);
  std::__cxx11::istringstream::~istringstream((istringstream *)&sin);
  std::__cxx11::string::~string((string *)&document);
  return bVar1;
}

Assistant:

bool FilterTool::FilterToolPrivate::ParseScript()
{

    // read in script contents from file
    const std::string document = GetScriptContents();
    std::istringstream sin(document);

    // set up JsonCPP reader and attempt to parse script
    Json::Value root;
    Json::CharReaderBuilder rbuilder;
    std::string errs;
    const bool ok = Json::parseFromStream(rbuilder, sin, &root, &errs);
    if (!ok) {
        // use built-in error reporting mechanism to alert user what was wrong with the script
        std::cerr << "bamtools filter ERROR: failed to parse script - see error message(s) below"
                  << std::endl
                  << errs;
        return false;
    }

    // initialize return status
    bool success = true;

    // see if root object contains multiple filters
    const Json::Value filters = root["filters"];
    if (!filters.isNull()) {

        // iterate over any filters found
        int filterIndex = 0;
        Json::Value::const_iterator filtersIter = filters.begin();
        Json::Value::const_iterator filtersEnd = filters.end();
        for (; filtersIter != filtersEnd; ++filtersIter, ++filterIndex) {
            Json::Value filter = (*filtersIter);

            // convert filter index to string
            std::string filterName;

            // if id tag supplied
            const Json::Value id = filter["id"];
            if (!id.isNull()) filterName = id.asString();

            // use array index
            else {
                std::stringstream convert;
                convert << filterIndex;
                filterName = convert.str();
            }

            // create & parse filter
            success &= ParseFilterObject(filterName, filter);
        }

        // see if user defined a "rule" for these filters
        // otherwise, use filter engine's default rule behavior
        std::string ruleString;
        const Json::Value rule = root["rule"];
        if (rule.isString()) ruleString = rule.asString();
        m_filterEngine.setRule(ruleString);

        // return success/fail
        return success;
    }

    // otherwise, root is the only filter (just contains properties)
    // create & parse filter named "ROOT"
    else
        success = ParseFilterObject("ROOT", root);

    // return success/failure
    return success;
}